

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  wchar_t *pwVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  lVar7 = *(long *)(this + 0x10);
  if (lVar7 != 0) {
    pwVar6 = *it;
    if (0 < lVar7) {
      pcVar8 = *(char **)(this + 8);
      lVar7 = lVar7 + 1;
      do {
        *pwVar6 = (int)*pcVar8;
        pcVar8 = pcVar8 + 1;
        pwVar6 = pwVar6 + 1;
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    *it = pwVar6;
  }
  auVar5 = _DAT_0023b030;
  auVar4 = _DAT_0023b020;
  auVar3 = _DAT_0023b010;
  pwVar2 = *it;
  lVar7 = *(long *)(this + 0x20);
  pwVar6 = pwVar2;
  if (lVar7 != 0) {
    pwVar6 = pwVar2 + lVar7;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar9 = lVar7 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar11._8_4_ = (int)uVar9;
    auVar11._0_8_ = uVar9;
    auVar11._12_4_ = (int)(uVar9 >> 0x20);
    lVar10 = 0;
    auVar11 = auVar11 ^ _DAT_0023b030;
    do {
      auVar13._8_4_ = (int)lVar10;
      auVar13._0_8_ = lVar10;
      auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar14 = (auVar13 | auVar4) ^ auVar5;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        pwVar2[lVar10] = wVar1;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        pwVar2[lVar10 + 1] = wVar1;
      }
      auVar13 = (auVar13 | auVar3) ^ auVar5;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        pwVar2[lVar10 + 2] = wVar1;
        pwVar2[lVar10 + 3] = wVar1;
      }
      lVar10 = lVar10 + 4;
    } while ((uVar9 - ((uint)(lVar7 + 0x3fffffffffffffffU) & 3)) + 4 != lVar10);
  }
  *it = pwVar6;
  int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

FMT_CONSTEXPR iterator begin() const { return data_; }